

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O2

S2Point * S2::InterpolateAtDistance
                    (S2Point *__return_storage_ptr__,S1Angle ax_angle,S2Point *a,S2Point *b)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  FloatType FVar5;
  bool bVar6;
  double dVar7;
  double dStack_90;
  Vector3_d normal;
  D local_68;
  Vector3_d tangent;
  S2LogMessage local_30;
  
  bVar6 = IsUnitLength(a);
  if (bVar6) {
    bVar6 = IsUnitLength(b);
    if (bVar6) {
      RobustCrossProd(&normal,a,b);
      Vector3<double>::CrossProd(&normal,a);
      local_68.c_._0_16_ = ZEXT816(0);
      local_68.c_[2] = 0.0;
      bVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                        ((BasicVector<Vector3,_double,_3UL> *)&tangent,&local_68);
      if (bVar6) {
        dVar3 = cos(ax_angle.radians_);
        dVar1 = a->c_[2];
        dVar4 = dVar3 * a->c_[0];
        dVar7 = dVar3 * a->c_[1];
        auVar2._8_4_ = SUB84(dVar7,0);
        auVar2._0_8_ = dVar4;
        auVar2._12_4_ = (int)((ulong)dVar7 >> 0x20);
        dVar7 = sin(ax_angle.radians_);
        FVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                          ((BasicVector<Vector3,_double,_3UL> *)&tangent);
        dVar7 = dVar7 / FVar5;
        dStack_90 = auVar2._8_8_;
        dStack_90 = dVar7 * tangent.c_[1] + dStack_90;
        local_68.c_[2] = dVar7 * tangent.c_[2] + dVar1 * dVar3;
        local_68.c_[1]._0_4_ = SUB84(dStack_90,0);
        local_68.c_[0] = dVar7 * tangent.c_[0] + dVar4;
        local_68.c_[1]._4_4_ = (int)((ulong)dStack_90 >> 0x20);
        util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                  (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_68);
        return __return_storage_ptr__;
      }
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
                 ,0x36,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_30.stream_,"Check failed: tangent != S2Point(0, 0, 0) ");
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&normal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
                 ,0x2f,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)normal.c_[1],"Check failed: S2::IsUnitLength(b) ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&normal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x2e,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)normal.c_[1],"Check failed: S2::IsUnitLength(a) ");
  }
  abort();
}

Assistant:

S2Point InterpolateAtDistance(S1Angle ax_angle,
                              const S2Point& a, const S2Point& b) {
  double ax = ax_angle.radians();

  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));

  // Use RobustCrossProd() to compute the tangent vector at A towards B.  The
  // result is always perpendicular to A, even if A=B or A=-B, but it is not
  // necessarily unit length.  (We effectively normalize it below.)
  Vector3_d normal = S2::RobustCrossProd(a, b);
  Vector3_d tangent = normal.CrossProd(a);
  S2_DCHECK(tangent != S2Point(0, 0, 0));

  // Now compute the appropriate linear combination of A and "tangent".  With
  // infinite precision the result would always be unit length, but we
  // normalize it anyway to ensure that the error is within acceptable bounds.
  // (Otherwise errors can build up when the result of one interpolation is
  // fed into another interpolation.)
  return (cos(ax) * a + (sin(ax) / tangent.Norm()) * tangent).Normalize();
}